

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

_binbuf * pointertobinbuf(t_pd *x,t_gpointer *gp,t_symbol *s,char *fname)

{
  t_gstub *ptVar1;
  int iVar2;
  _array *p_Var3;
  t_template *x_00;
  long lVar4;
  char *pcVar5;
  char *fmt;
  char *pcVar6;
  t_symbol *s_00;
  int type;
  int onset;
  t_symbol *arraytype;
  int local_40;
  int local_3c;
  t_symbol *local_38;
  
  ptVar1 = gp->gp_stub;
  if (ptVar1->gs_which == 1) {
    p_Var3 = (_array *)(gp->gp_un).gp_scalar;
    if (p_Var3 == (_array *)0x0) {
      s_00 = (t_symbol *)0x0;
      goto LAB_00154b1f;
    }
  }
  else {
    p_Var3 = (ptVar1->gs_un).gs_array;
  }
  s_00 = p_Var3->a_templatesym;
LAB_00154b1f:
  if (s_00 == (t_symbol *)0x0) {
    pd_error(x,"%s: bad pointer",fname);
  }
  else {
    x_00 = template_findbyname(s_00);
    if (x_00 == (t_template *)0x0) {
      pd_error(x,"%s: couldn\'t find template %s",fname,s_00->s_name);
    }
    else {
      iVar2 = template_find_field(x_00,s,&local_3c,&local_40,&local_38);
      if (iVar2 == 0) {
        pcVar5 = s_00->s_name;
        pcVar6 = s->s_name;
        fmt = "%s: %s.%s: no such field";
      }
      else {
        if (local_40 == 2) {
          lVar4 = 0x18;
          if (ptVar1->gs_which == 2) {
            lVar4 = 0;
          }
          return *(_binbuf **)
                  ((long)((gp->gp_un).gp_scalar)->sc_vec + (long)local_3c * 8 + lVar4 + -0x18);
        }
        pcVar5 = s_00->s_name;
        pcVar6 = s->s_name;
        fmt = "%s: %s.%s: not a list";
      }
      pd_error(x,fmt,fname,pcVar5,pcVar6);
    }
  }
  return (_binbuf *)0x0;
}

Assistant:

t_binbuf *pointertobinbuf(t_pd *x, t_gpointer *gp, t_symbol *s,
    const char *fname)
{
    t_symbol *templatesym = gpointer_gettemplatesym(gp), *arraytype;
    t_template *template;
    int onset, type;
    t_binbuf *b;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    if (!templatesym)
    {
        pd_error(x, "%s: bad pointer", fname);
        return (0);
    }
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "%s: couldn't find template %s", fname,
            templatesym->s_name);
        return (0);
    }
    if (!template_find_field(template, s, &onset, &type, &arraytype))
    {
        pd_error(x, "%s: %s.%s: no such field", fname,
            templatesym->s_name, s->s_name);
        return (0);
    }
    if (type != DT_TEXT)
    {
        pd_error(x, "%s: %s.%s: not a list", fname,
            templatesym->s_name, s->s_name);
        return (0);
    }
    if (gs->gs_which == GP_ARRAY)
        vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    return (vec[onset].w_binbuf);
}